

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testfonts.cpp
# Opt level: O3

void test_font_dimensions(wins *wins_ar,int ar_len)

{
  long *plVar1;
  long lVar2;
  
  test_string = "XpgyI";
  test_str_len = 5;
  Am_Font::operator=((Am_Font *)&test_font,(Am_Font *)&font_vgi);
  if (ar_len < 1) {
    test_string = ".,.,.";
  }
  else {
    lVar2 = 0;
    do {
      plVar1 = *(long **)((long)&wins_ar->font_win + lVar2);
      (**(code **)(*plVar1 + 0xd0))
                (plVar1,&test_font,test_string,test_str_len,&test_string_width,&test_string_ascent,
                 &test_string_descent,&test_string_left_bearing,&test_string_right_bearing);
      test_string_height = test_string_descent + test_string_ascent;
      (**(code **)(*plVar1 + 0x170))
                (plVar1,&black,test_string,test_str_len,&test_font,0x50,0x104,0,&Am_No_Style,0);
      (**(code **)(*plVar1 + 0x160))
                (plVar1,&black,&Am_No_Style,0x50,0x104,test_string_width,test_string_height,0);
      (**(code **)(*plVar1 + 0xa0))(plVar1);
      lVar2 = lVar2 + 0x40;
    } while ((ulong)(uint)ar_len << 6 != lVar2);
    test_string = ".,.,.";
    if (0 < ar_len) {
      lVar2 = 0;
      do {
        plVar1 = *(long **)((long)&wins_ar->font_win + lVar2);
        (**(code **)(*plVar1 + 0xd0))
                  (plVar1,&test_font,test_string,test_str_len,&test_string_width,&test_string_ascent
                   ,&test_string_descent,&test_string_left_bearing,&test_string_right_bearing);
        test_string_height = test_string_descent + test_string_ascent;
        (**(code **)(*plVar1 + 0x170))
                  (plVar1,&black,test_string,test_str_len,&test_font,0x78,0x104,0,&Am_No_Style,0);
        (**(code **)(*plVar1 + 0x160))
                  (plVar1,&black,&Am_No_Style,0x78,0x104,test_string_width,test_string_height,0);
        (**(code **)(*plVar1 + 0xa0))(plVar1);
        lVar2 = lVar2 + 0x40;
      } while ((ulong)(uint)ar_len << 6 != lVar2);
    }
  }
  return;
}

Assistant:

void
test_font_dimensions(wins *wins_ar, int ar_len)
{

  test_string = "XpgyI";
  test_str_len = 5;
  test_font = font_vgi;
  int i;
  for (i = 0; i < ar_len; i++) {
    Am_Drawonable *font_win = wins_ar[i].font_win;
    update_font_numbers(font_win);

    font_win->Draw_Text(black, test_string, test_str_len, test_font, 80, 260);
    font_win->Draw_Rectangle(black, Am_No_Style, 80, 260, test_string_width,
                             test_string_height);
    font_win->Flush_Output();
  }

  test_string = ".,.,.";

  for (i = 0; i < ar_len; i++) {
    Am_Drawonable *font_win = wins_ar[i].font_win;
    update_font_numbers(font_win);

    font_win->Draw_Text(black, test_string, test_str_len, test_font, 120, 260);
    font_win->Draw_Rectangle(black, Am_No_Style, 120, 260, test_string_width,
                             test_string_height);
    font_win->Flush_Output();
  }
}